

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

void __thiscall CVmObjVector::CVmObjVector(CVmObjVector *this,size_t element_count)

{
  CVmObjVector *in_RSI;
  undefined8 *in_RDI;
  CVmObjVector *unaff_retaddr;
  undefined8 *cnt;
  
  cnt = in_RDI;
  CVmObjCollection::CVmObjCollection(&in_RSI->super_CVmObjCollection);
  *in_RDI = &PTR_get_metaclass_reg_00449a70;
  alloc_vector(unaff_retaddr,(size_t)cnt);
  set_element_count(in_RSI,(size_t)in_RDI);
  return;
}

Assistant:

CVmObjVector::CVmObjVector(VMG_ size_t element_count)
{
    /* allocate space */
    alloc_vector(vmg_ element_count);

    /* 
     *   a vector intially has no elements in use; the element_count
     *   merely gives the number of slots to be allocated initially (this
     *   won't affect the allocation count, which is stored separately) 
     */
    set_element_count(0);
}